

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chip8.cpp
# Opt level: O3

void __thiscall Chip8::OP_DXYN(Chip8 *this)

{
  byte bVar1;
  byte bVar2;
  uint8_t uVar3;
  ushort uVar4;
  ushort uVar5;
  uint uVar6;
  uint uVar7;
  uint x;
  int iVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  
  uVar4 = this->opcode;
  bVar1 = this->registers[uVar4 >> 8 & 0xf];
  bVar2 = this->registers[uVar4 >> 4 & 0xf];
  uVar6 = this->VIDEO_WIDTH;
  uVar7 = this->VIDEO_HEIGHT;
  this->registers[0xf] = '\0';
  if ((uVar4 & 0xf) != 0) {
    uVar11 = 0;
    uVar5 = this->index;
    do {
      uVar3 = this->memory[uVar11 + uVar5];
      iVar8 = 0;
      do {
        if ((char)(uVar3 << ((byte)iVar8 & 0x1f)) < '\0') {
          uVar9 = this->VIDEO_WIDTH * ((uint)bVar2 % uVar7 + (int)uVar11) + iVar8 +
                  (uint)bVar1 % uVar6;
          uVar10 = this->display[uVar9];
          if (uVar10 == 0xffffffff) {
            this->registers[0xf] = '\x01';
            uVar10 = this->display[uVar9];
          }
          this->display[uVar9] = ~uVar10;
        }
        iVar8 = iVar8 + 1;
      } while (iVar8 != 8);
      uVar11 = uVar11 + 1;
    } while (uVar11 != (uVar4 & 0xf));
  }
  return;
}

Assistant:

void Chip8::OP_DXYN() {
    uint8_t Vx = registers[(opcode & 0x0F00u) >> 8u];
    uint8_t Vy = registers[(opcode & 0x00F0u) >> 4u];
    uint8_t xPos = Vx % VIDEO_WIDTH;
    uint8_t yPos = Vy % VIDEO_HEIGHT;
    uint8_t h = (opcode & 0x000Fu);
    uint8_t pixel;
    registers[0xF] = 0;

    for(unsigned int y = 0; y < h; y++){
        pixel = memory[index + y];
        for(unsigned int x = 0; x < 8; x++){
            if(pixel & (0x80u >> x)){
                if(display[(xPos + x) + VIDEO_WIDTH*(yPos + y)] == 0xFFFFFFFF)
                    registers[0xF] = 1;
                display[(xPos + x) + VIDEO_WIDTH*(yPos + y)] ^= 0xFFFFFFFF;
            }
        }
    }




}